

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::ParseTableOrClass(SQCompiler *this,SQInteger separator,SQInteger terminator)

{
  long lVar1;
  SQInteger terminator_00;
  long in_RDX;
  SQCompiler *in_RSI;
  long *in_RDI;
  bool bVar2;
  SQObject SVar3;
  SQInteger table;
  uchar flags;
  SQInteger attrs;
  SQInteger key;
  SQInteger val;
  SQObject id;
  SQInteger tk;
  bool isstatic;
  bool hasattrs;
  SQInteger nkeys;
  SQInteger tpos;
  SQCompiler *in_stack_fffffffffffffeb0;
  SQFuncState *in_stack_fffffffffffffeb8;
  SQFuncState *in_stack_fffffffffffffec0;
  SQInteger in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffed0;
  long in_stack_fffffffffffffed8;
  SQOpcode _op;
  SQFuncState *in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  SQChar *in_stack_fffffffffffffef0;
  SQFuncState *in_stack_fffffffffffffef8;
  SQObject *cons;
  SQFuncState *in_stack_ffffffffffffff10;
  SQObjectValue in_stack_ffffffffffffff50;
  SQObjectType in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  SQObjectValue in_stack_ffffffffffffff70;
  SQObjectValue in_stack_ffffffffffffff90;
  SQObjectType in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  SQObjectValue in_stack_ffffffffffffffa0;
  
  terminator_00 = SQFuncState::GetCurrentPos((SQFuncState *)0x126075);
  do {
    if (*in_RDI == in_RDX) {
      if (in_RSI == (SQCompiler *)0x2c) {
        SQFuncState::SetInstructionParam
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8);
      }
      Lex(in_stack_fffffffffffffeb0);
      return;
    }
    bVar2 = false;
    if (in_RSI == (SQCompiler *)0x3b) {
      bVar2 = *in_RDI == 0x140;
      if (bVar2) {
        in_stack_ffffffffffffff10 = (SQFuncState *)in_RDI[1];
        SQFuncState::PushTarget(in_stack_fffffffffffffeb8,(SQInteger)in_stack_fffffffffffffeb0);
        SQFuncState::AddInstruction
                  (in_stack_fffffffffffffee0,(SQOpcode)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (SQInteger)in_stack_fffffffffffffec0,(SQInteger)in_stack_fffffffffffffeb8);
        Lex(in_stack_fffffffffffffeb0);
        ParseTableOrClass(in_RSI,in_RDX,terminator_00);
      }
      if (*in_RDI == 0x142) {
        Lex(in_stack_fffffffffffffeb0);
      }
    }
    cons = (SQObject *)*in_RDI;
    if (cons == (SQObject *)0x5b) {
      Lex(in_stack_fffffffffffffeb0);
      CommaExpr(in_stack_fffffffffffffeb0);
      SVar3 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50.nInteger);
      in_stack_ffffffffffffffa0 = SVar3._unVal;
      in_stack_ffffffffffffff98 = SVar3._type;
      SVar3 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50.nInteger);
      in_stack_ffffffffffffff90 = SVar3._unVal;
      Expression((SQCompiler *)in_stack_ffffffffffffff70.pTable);
    }
    else if (cons == (SQObject *)0x103) {
      if (in_RSI != (SQCompiler *)0x2c) goto LAB_00126412;
      in_stack_fffffffffffffed8 = in_RDI[1];
      in_stack_fffffffffffffee0 =
           (SQFuncState *)
           SQFuncState::PushTarget(in_stack_fffffffffffffeb8,(SQInteger)in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffed0 = in_RDI[1];
      Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50.nInteger);
      SQFuncState::GetConstant(in_stack_ffffffffffffff10,cons);
      SQFuncState::AddInstruction
                (in_stack_fffffffffffffee0,(SQOpcode)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (SQInteger)in_stack_fffffffffffffec0,(SQInteger)in_stack_fffffffffffffeb8);
      SVar3 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50.nInteger);
      in_stack_ffffffffffffff70 = SVar3._unVal;
      Expression((SQCompiler *)in_stack_ffffffffffffff70.pTable);
    }
    else if ((cons == (SQObject *)0x11d) || (cons == (SQObject *)0x136)) {
      lVar1 = *in_RDI;
      Lex(in_stack_fffffffffffffeb0);
      if (lVar1 == 0x11d) {
        Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50.nInteger);
      }
      else {
        SQFuncState::CreateString
                  (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50.nInteger);
      in_stack_fffffffffffffee8 = in_RDI[1];
      in_stack_fffffffffffffef0 =
           (SQChar *)
           SQFuncState::PushTarget(in_stack_fffffffffffffeb8,(SQInteger)in_stack_fffffffffffffeb0);
      SQFuncState::GetConstant(in_stack_ffffffffffffff10,cons);
      SQFuncState::AddInstruction
                (in_stack_fffffffffffffee0,(SQOpcode)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (SQInteger)in_stack_fffffffffffffec0,(SQInteger)in_stack_fffffffffffffeb8);
      CreateFunction((SQCompiler *)in_stack_ffffffffffffffa0.pTable,
                     (SQObject *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
      in_stack_fffffffffffffef8 = (SQFuncState *)in_RDI[1];
      SQFuncState::PushTarget(in_stack_fffffffffffffeb8,(SQInteger)in_stack_fffffffffffffeb0);
      sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI[1] + 0x78));
      SQFuncState::AddInstruction
                (in_stack_fffffffffffffee0,(SQOpcode)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (SQInteger)in_stack_fffffffffffffec0,(SQInteger)in_stack_fffffffffffffeb8);
    }
    else {
LAB_00126412:
      in_stack_fffffffffffffec0 = (SQFuncState *)in_RDI[1];
      in_stack_fffffffffffffec8 =
           SQFuncState::PushTarget(in_stack_fffffffffffffeb8,(SQInteger)in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffeb8 = (SQFuncState *)in_RDI[1];
      SVar3 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50.nInteger);
      in_stack_ffffffffffffff58 = SVar3._type;
      SQFuncState::GetConstant(in_stack_ffffffffffffff10,cons);
      SQFuncState::AddInstruction
                (in_stack_fffffffffffffee0,(SQOpcode)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (SQInteger)in_stack_fffffffffffffec0,(SQInteger)in_stack_fffffffffffffeb8);
      SVar3 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50.nInteger);
      in_stack_ffffffffffffff50 = SVar3._unVal;
      Expression((SQCompiler *)in_stack_ffffffffffffff70.pTable);
    }
    if ((SQCompiler *)*in_RDI == in_RSI) {
      Lex(in_stack_fffffffffffffeb0);
    }
    SQFuncState::PopTarget(in_stack_fffffffffffffec0);
    SQFuncState::PopTarget(in_stack_fffffffffffffec0);
    if (bVar2) {
      in_stack_fffffffffffffeb0 = (SQCompiler *)SQFuncState::PopTarget(in_stack_fffffffffffffec0);
    }
    else {
      in_stack_fffffffffffffeb0 = (SQCompiler *)0xffffffffffffffff;
    }
    SQFuncState::TopTarget((SQFuncState *)0x126591);
    _op = (SQOpcode)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    if (in_RSI == (SQCompiler *)0x2c) {
      SQFuncState::AddInstruction
                (in_stack_fffffffffffffee0,_op,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (SQInteger)in_stack_fffffffffffffec0,(SQInteger)in_stack_fffffffffffffeb8);
    }
    else {
      SQFuncState::AddInstruction
                (in_stack_fffffffffffffee0,_op,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (SQInteger)in_stack_fffffffffffffec0,(SQInteger)in_stack_fffffffffffffeb8);
    }
  } while( true );
}

Assistant:

void ParseTableOrClass(SQInteger separator,SQInteger terminator)
    {
        SQInteger tpos = _fs->GetCurrentPos(),nkeys = 0;
        while(_token != terminator) {
            bool hasattrs = false;
            bool isstatic = false;
            //check if is an attribute
            if(separator == ';') {
                if(_token == TK_ATTR_OPEN) {
                    _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE); Lex();
                    ParseTableOrClass(',',TK_ATTR_CLOSE);
                    hasattrs = true;
                }
                if(_token == TK_STATIC) {
                    isstatic = true;
                    Lex();
                }
            }
            switch(_token) {
            case TK_FUNCTION:
            case TK_CONSTRUCTOR:{
                SQInteger tk = _token;
                Lex();
                SQObject id = tk == TK_FUNCTION ? Expect(TK_IDENTIFIER) : _fs->CreateString(_SC("constructor"));
                Expect(_SC('('));
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                CreateFunction(id);
                _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
                                }
                                break;
            case _SC('['):
                Lex(); CommaExpr(); Expect(_SC(']'));
                Expect(_SC('=')); Expression();
                break;
            case TK_STRING_LITERAL: //JSON
                if(separator == ',') { //only works for tables
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_STRING_LITERAL)));
                    Expect(_SC(':')); Expression();
                    break;
                }
            default :
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                Expect(_SC('=')); Expression();
            }
            if(_token == separator) Lex();//optional comma/semicolon
            nkeys++;
            SQInteger val = _fs->PopTarget();
            SQInteger key = _fs->PopTarget();
            SQInteger attrs = hasattrs ? _fs->PopTarget():-1;
            ((void)attrs);
            assert((hasattrs && (attrs == key-1)) || !hasattrs);
            unsigned char flags = (hasattrs?NEW_SLOT_ATTRIBUTES_FLAG:0)|(isstatic?NEW_SLOT_STATIC_FLAG:0);
            SQInteger table = _fs->TopTarget(); //<<BECAUSE OF THIS NO COMMON EMIT FUNC IS POSSIBLE
            if(separator == _SC(',')) { //hack recognizes a table from the separator
                _fs->AddInstruction(_OP_NEWSLOT, 0xFF, table, key, val);
            }
            else {
                _fs->AddInstruction(_OP_NEWSLOTA, flags, table, key, val); //this for classes only as it invokes _newmember
            }
        }
        if(separator == _SC(',')) //hack recognizes a table from the separator
            _fs->SetInstructionParam(tpos, 1, nkeys);
        Lex();
    }